

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adler32.c
# Opt level: O1

uLong adler32_combine_(uLong adler1,uLong adler2,off_t len2)

{
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  
  if (-1 < len2) {
    uVar4 = adler1 & 0xffff;
    lVar2 = (((adler2 >> 0x10 & 0xffff) + (adler1 >> 0x10 & 0xffff)) - (ulong)len2 % 0xfff1) +
            (((ulong)len2 % 0xfff1) * uVar4) % 0xfff1;
    uVar1 = lVar2 + 0xfff1;
    uVar3 = 0xfff0;
    if (0xfff0 < (int)uVar4 + (int)(adler2 & 0xffff) + 0xfff0U) {
      uVar3 = (uVar4 - 1) + (adler2 & 0xffff);
    }
    uVar4 = uVar3 - 0xfff1;
    if (uVar3 < 0xfff1) {
      uVar4 = uVar3;
    }
    uVar3 = lVar2 - 0xfff1;
    if (uVar1 < 0x1ffe2) {
      uVar3 = uVar1;
    }
    uVar1 = uVar3 * 0x10000 - 0xfff10000;
    if (uVar3 < 0xfff1) {
      uVar1 = uVar3 * 0x10000;
    }
    return uVar1 | uVar4;
  }
  return 0xffffffff;
}

Assistant:

local uLong adler32_combine_(uLong adler1, uLong adler2, z_off64_t len2) {
    unsigned long sum1;
    unsigned long sum2;
    unsigned rem;

    /* for negative len, return invalid adler32 as a clue for debugging */
    if (len2 < 0)
        return 0xffffffffUL;

    /* the derivation of this formula is left as an exercise for the reader */
    MOD63(len2);                /* assumes len2 >= 0 */
    rem = (unsigned)len2;
    sum1 = adler1 & 0xffff;
    sum2 = rem * sum1;
    MOD(sum2);
    sum1 += (adler2 & 0xffff) + BASE - 1;
    sum2 += ((adler1 >> 16) & 0xffff) + ((adler2 >> 16) & 0xffff) + BASE - rem;
    if (sum1 >= BASE) sum1 -= BASE;
    if (sum1 >= BASE) sum1 -= BASE;
    if (sum2 >= ((unsigned long)BASE << 1)) sum2 -= ((unsigned long)BASE << 1);
    if (sum2 >= BASE) sum2 -= BASE;
    return sum1 | (sum2 << 16);
}